

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O1

bool __thiscall
Gudhi::Toplex_map::membership<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (Toplex_map *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  __node_base *p_Var5;
  Vertex local_20;
  
  if ((this->t0)._M_h._M_element_count != 0) {
    local_20 = best_index<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                         (this,vertex_range);
    sVar3 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)this,&local_20);
    if (sVar3 != 0) {
      bVar1 = maximality<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                        (this,vertex_range);
      if (bVar1) {
        return true;
      }
      pmVar4 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this,&local_20);
      p_Var5 = &(pmVar4->_M_h)._M_before_begin;
      do {
        p_Var5 = p_Var5->_M_nxt;
        bVar1 = p_Var5 != (__node_base *)0x0;
        if (p_Var5 == (__node_base *)0x0) {
          return bVar1;
        }
        bVar2 = included<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                          (vertex_range,
                           (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)p_Var5[1]._M_nxt);
      } while (!bVar2);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Toplex_map::membership(const Input_vertex_range& vertex_range) const {
  if (t0.size() == 0) return false;
  const Vertex& v = best_index(vertex_range);
  if (!t0.count(v)) return false;
  if (maximality(vertex_range)) return true;
  for (const Toplex_map::Simplex_ptr& sptr : t0.at(v))
    if (included(vertex_range, *sptr)) return true;
  return false;
}